

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::Address::Set(Error *__return_storage_ptr__,Address *this,ByteArray *aRawAddr)

{
  char *pcVar1;
  long lVar2;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar3;
  format_args args;
  writer write;
  string local_b8;
  writer local_98;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  lVar2 = (long)(aRawAddr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(aRawAddr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start;
  if ((lVar2 == 4) || (lVar2 == 0x10)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mBytes,aRawAddr);
  }
  else {
    local_68.types_[0] = none_type;
    from = "IP address must has length of 4(IPv4) or 16(IPv6)";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "IP address must has length of 4(IPv4) or 16(IPv6)";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x31;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_98.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_00143675:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,from,to);
        from = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",&local_68);
        bVar3 = true;
      }
      else {
        to = from + 1;
        bVar3 = to != "";
        if (bVar3) {
          if (*to != '{') {
            pcVar1 = from + 2;
            do {
              to = pcVar1;
              bVar3 = to != "";
              if (to == "") goto LAB_00143671;
              pcVar1 = to + 1;
            } while (*to != '{');
          }
          bVar3 = true;
        }
LAB_00143671:
        if (bVar3) goto LAB_00143675;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,from,"");
        bVar3 = false;
      }
    } while (bVar3);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"IP address must has length of 4(IPv4) or 16(IPv6)",
               (string_view)ZEXT816(0x31),args);
    local_90 = kInvalidArgs;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    __return_storage_ptr__->mCode = local_90;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Address::Set(const ByteArray &aRawAddr)
{
    Error error;

    if (aRawAddr.size() != kIpv4Size && aRawAddr.size() != kIpv6Size)
    {
        ExitNow(error = ERROR_INVALID_ARGS("IP address must has length of 4(IPv4) or 16(IPv6)"));
    }

    mBytes = aRawAddr;

exit:
    return error;
}